

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

Maybe<capnp::InterfaceSchema::Method> * __thiscall
capnp::InterfaceSchema::findMethodByName
          (Maybe<capnp::InterfaceSchema::Method> *__return_storage_ptr__,InterfaceSchema *this,
          StringPtr name,uint *counter)

{
  uint uVar1;
  RawSchema *pRVar2;
  NullableValue<capnp::InterfaceSchema::Method> *pNVar3;
  bool bVar4;
  Schema SVar5;
  uint uVar6;
  uint uVar7;
  uint64_t id;
  uint uVar8;
  unsigned_long i;
  ulong uVar9;
  StringPtr name_00;
  ArrayPtr<const_char> local_120;
  RawBrandedSchema *local_110;
  uint *local_108;
  RawSchema *local_100;
  ArrayPtr<const_char> local_f8;
  DebugComparison<unsigned_int,_const_unsigned_int_&> _kjCondition;
  WirePointer *pWStack_c0;
  StructDataBitCount local_b8;
  StructPointerCount SStack_b4;
  undefined2 uStack_b2;
  int iStack_b0;
  undefined4 uStack_ac;
  Reader superclass;
  Fault f;
  uint local_50;
  
  name_00.content.size_ = name.content.size_;
  uVar1 = *counter;
  *counter = uVar1 + 1;
  _kjCondition.left = uVar1;
  _kjCondition.right = &MAX_SUPERCLASSES;
  _kjCondition.op.content.ptr = " < ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = uVar1 < 0x40;
  local_108 = counter;
  if (uVar1 < 0x40) {
    pRVar2 = ((this->super_Schema).raw)->generic;
    getMethods((MethodList *)&f,this);
    uVar1 = pRVar2->memberCount;
    uVar8 = 0;
    local_110 = (RawBrandedSchema *)name.content.ptr;
    local_100 = pRVar2;
    local_f8.ptr = name.content.ptr;
    local_f8.size_ = name_00.content.size_;
    while (uVar7 = uVar1, uVar8 < uVar7) {
      MethodList::operator[]
                ((Method *)&_kjCondition,(MethodList *)&f,
                 (uint)*(ushort *)
                        ((long)local_100->membersByName + (ulong)(uVar8 + uVar7 & 0xfffffffe)));
      superclass._reader._32_8_ = _local_b8;
      superclass._reader.data = (void *)_kjCondition._32_8_;
      superclass._reader.pointers = pWStack_c0;
      superclass._reader.segment = (SegmentReader *)_kjCondition.op.content.ptr;
      superclass._reader.capTable = (CapTableReader *)_kjCondition.op.content.size_;
      local_120 = (ArrayPtr<const_char>)
                  capnp::schema::Method::Reader::getName((Reader *)&superclass);
      bVar4 = kj::ArrayPtr<const_char>::operator==(&local_120,&local_f8);
      if (bVar4) {
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.parent.super_Schema.raw =
             (RawBrandedSchema *)_kjCondition._0_8_;
        *(uint **)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = _kjCondition.right;
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.segment =
             (SegmentReader *)_kjCondition.op.content.ptr;
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.capTable =
             (CapTableReader *)_kjCondition.op.content.size_;
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.data = (void *)_kjCondition._32_8_
        ;
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.pointers = pWStack_c0;
        pNVar3 = &__return_storage_ptr__->ptr;
        *(StructDataBitCount *)((long)&pNVar3->field_1 + 0x30) = local_b8;
        *(StructPointerCount *)((long)&pNVar3->field_1 + 0x34) = SStack_b4;
        *(undefined2 *)((long)&pNVar3->field_1 + 0x36) = uStack_b2;
        *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = iStack_b0;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x3c) = uStack_ac;
        return __return_storage_ptr__;
      }
      uVar6 = uVar8 + uVar7 >> 1;
      bVar4 = kj::ArrayPtr<const_char>::operator<(&local_120,&local_f8);
      uVar1 = uVar6;
      if (bVar4) {
        uVar1 = uVar7;
        uVar8 = uVar6 + 1;
      }
    }
    (__return_storage_ptr__->ptr).isSet = false;
    Schema::getProto((Reader *)&superclass,&this->super_Schema);
    _kjCondition._32_8_ = superclass._reader._32_8_;
    _kjCondition.op.content.ptr = (char *)superclass._reader.data;
    _kjCondition.op.content.size_ = (size_t)superclass._reader.pointers;
    _kjCondition._0_8_ = superclass._reader.segment;
    _kjCondition.right = (uint *)superclass._reader.capTable;
    capnp::schema::Node::Interface::Reader::getSuperclasses((Reader *)&f,(Reader *)&_kjCondition);
    uVar9 = 0;
    do {
      if (local_50 == uVar9) {
        return __return_storage_ptr__;
      }
      capnp::_::ListReader::getStructElement
                (&superclass._reader,(ListReader *)&f,(ElementCount)uVar9);
      if (superclass._reader.dataSize < 0x40) {
        id = 0;
      }
      else {
        id = *superclass._reader.data;
      }
      SVar5 = Schema::getDependency(&this->super_Schema,id,(ElementCount)uVar9 | 0x4000000);
      local_120.ptr = (char *)SVar5.raw;
      local_f8.ptr = (char *)Schema::asInterface((Schema *)&local_120);
      name_00.content.ptr = (char *)local_110;
      findMethodByName((Maybe<capnp::InterfaceSchema::Method> *)&_kjCondition,
                       (InterfaceSchema *)&local_f8,name_00,local_108);
      kj::Maybe<capnp::InterfaceSchema::Method>::operator=
                (__return_storage_ptr__,(Maybe<capnp::InterfaceSchema::Method> *)&_kjCondition);
      uVar9 = uVar9 + 1;
    } while ((__return_storage_ptr__->ptr).isSet != true);
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int_const&>&,char_const(&)[53]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x24a,FAILED,"counter++ < MAX_SUPERCLASSES",
               "_kjCondition,\"Cyclic or absurdly-large inheritance graph detected.\"",&_kjCondition
               ,(char (*) [53])"Cyclic or absurdly-large inheritance graph detected.");
    (__return_storage_ptr__->ptr).isSet = false;
    kj::_::Debug::Fault::~Fault(&f);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<InterfaceSchema::Method> InterfaceSchema::findMethodByName(
    kj::StringPtr name, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return kj::none;
  }

  auto result = findSchemaMemberByName(raw->generic, name, getMethods());

  if (result == kj::none) {
    // Search superclasses.
    // TODO(perf):  This may be somewhat slow, and in the case of lots of diamond dependencies it
    //   could get pathological.  Arguably we should generate a flat list of transitive
    //   superclasses to search and store it in the RawSchema.  It's problematic, though, because
    //   this means that a dynamically-loaded RawSchema cannot be correctly constructed until all
    //   superclasses have been loaded, which imposes an ordering requirement on SchemaLoader or
    //   requires updating subclasses whenever a new superclass is loaded.
    auto superclasses = getProto().getInterface().getSuperclasses();
    for (auto i: kj::indices(superclasses)) {
      auto superclass = superclasses[i];
      uint location = _::RawBrandedSchema::makeDepLocation(
          _::RawBrandedSchema::DepKind::SUPERCLASS, i);
      result = getDependency(superclass.getId(), location)
          .asInterface().findMethodByName(name, counter);
      if (result != kj::none) {
        break;
      }
    }
  }

  return result;
}